

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::rangeToString<std::filesystem::__cxx11::directory_iterator>
                   (string *__return_storage_ptr__,directory_iterator *range)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  directory_iterator local_28;
  
  local_38 = (range->_M_dir)._M_ptr;
  local_30 = (range->_M_dir)._M_refcount._M_pi;
  if (local_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0014580f:
    bVar1 = true;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
      this = (range->_M_dir)._M_refcount._M_pi;
      if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0014580f;
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
      this = local_30;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    bVar1 = false;
  }
  local_28._M_dir._M_ptr = (element_type *)0x0;
  local_28._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Detail::
  rangeToString<std::filesystem::__cxx11::directory_iterator,std::filesystem::__cxx11::directory_iterator>
            (__return_storage_ptr__,(Detail *)&local_38,&local_28,(directory_iterator *)local_38);
  if (local_28._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28._M_dir._M_refcount._M_pi);
  }
  if (!bVar1) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString( Range const& range ) {
        return ::Catch::Detail::rangeToString( begin( range ), end( range ) );
    }